

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void FreeTSInfo(void *ClientData)

{
  long *in_RDI;
  FFSTimestepInfo TSInfo;
  
  if (*in_RDI != 0) {
    free_FFSBuffer(*in_RDI);
  }
  if (in_RDI[1] != 0) {
    no_tsan_free_FFSBuffer((FFSBuffer)0xf5e2c5);
  }
  free(in_RDI);
  return;
}

Assistant:

static void FreeTSInfo(void *ClientData)
{
    FFSTimestepInfo TSInfo = (FFSTimestepInfo)ClientData;
    if (TSInfo->MetaEncodeBuffer)
        free_FFSBuffer(TSInfo->MetaEncodeBuffer);
    if (TSInfo->DataEncodeBuffer)
        no_tsan_free_FFSBuffer(TSInfo->DataEncodeBuffer);
    free(TSInfo);
}